

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

bool __thiscall
pstore::file::file_handle::lock
          (file_handle *this,uint64_t offset,size_t size,lock_kind kind,blocking_mode block)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  if ((long)(size | offset) < 0) {
    raise<std::errc,char[5]>(invalid_argument,(char (*) [5])"lock");
  }
  ensure_open(this);
  iVar1 = 7;
  if (block != blocking) {
    iVar1 = 0;
  }
  iVar3 = 6;
  if (block != non_blocking) {
    iVar3 = iVar1;
  }
  iVar1 = lock_reg(this->file_,iVar3,(ushort)(kind == exclusive_write),offset,0,size);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar3 = *piVar2;
    if ((block != non_blocking) || ((iVar3 != 0xb && (iVar3 != 0xd)))) {
      std::__cxx11::string::string((string *)&bStack_48,(string *)&this->path_);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (iVar3,"fcntl/lock failed",&bStack_48);
    }
  }
  return iVar1 == 0;
}

Assistant:

bool file_handle::lock (std::uint64_t const offset, std::size_t const size,
                                lock_kind const kind, blocking_mode const block) {
            if (offset > uoff_max || size > uoff_max) {
                raise (std::errc::invalid_argument, "lock");
            }
            this->ensure_open ();

            int cmd = 0;
            switch (block) {
            case blocking_mode::non_blocking: cmd = F_SETLK; break;
            case blocking_mode::blocking: cmd = F_SETLKW; break;
            }

            short type = 0;
            switch (kind) {
            case lock_kind::shared_read: type = F_RDLCK; break;
            case lock_kind::exclusive_write: type = F_WRLCK; break;
            }

            bool got_lock = true;
            if (file_handle::lock_reg (file_,
                                       cmd, // set a file lock (maybe a blocking one),
                                       type, static_cast<off_t> (offset), SEEK_SET,
                                       static_cast<off_t> (size)) != 0) {
                int const err = errno;
                if (block == blocking_mode::non_blocking && (err == EACCES || err == EAGAIN)) {
                    // The cmd argument is F_SETLK; the type of lock (l_type) is a shared (F_RDLCK)
                    // or exclusive (F_WRLCK) lock and the segment of a file to be locked is already
                    // exclusive-locked by another process, or the type is an exclusive lock and
                    // some portion of the segment of a file to be locked is already shared-locked
                    // or exclusive-locked by another process
                    got_lock = false;
                } else {
                    raise_file_error (err, "fcntl/lock failed", this->path ());
                }
            }
            return got_lock;
        }